

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O0

basic_ostream<char,_std::char_traits<char>_> *
clipp::operator<<(basic_ostream<char,_std::char_traits<char>_> *os,man_page *man)

{
  bool bVar1;
  int iVar2;
  reference this;
  ulong uVar3;
  string *psVar4;
  ostream *poVar5;
  section *section;
  const_iterator __end2;
  const_iterator __begin2;
  man_page *__range2;
  allocator<char> local_41;
  string local_40 [8];
  doc_string secSpc;
  bool first;
  man_page *man_local;
  basic_ostream<char,_std::char_traits<char>_> *os_local;
  
  secSpc.field_2._M_local_buf[0xf] = '\x01';
  iVar2 = man_page::section_row_spacing(man);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_40,(long)(iVar2 + 1),'\n',&local_41);
  std::allocator<char>::~allocator(&local_41);
  __end2 = man_page::begin(man);
  section = (section *)man_page::end(man);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_clipp::man_page::section_*,_std::vector<clipp::man_page::section,_std::allocator<clipp::man_page::section>_>_>
                                *)&section);
    if (!bVar1) break;
    this = __gnu_cxx::
           __normal_iterator<const_clipp::man_page::section_*,_std::vector<clipp::man_page::section,_std::allocator<clipp::man_page::section>_>_>
           ::operator*(&__end2);
    man_page::section::content_abi_cxx11_(this);
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      if ((secSpc.field_2._M_local_buf[0xf] & 1U) == 0) {
        std::operator<<((ostream *)os,local_40);
      }
      else {
        secSpc.field_2._M_local_buf[0xf] = '\0';
      }
      man_page::section::title_abi_cxx11_(this);
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) == 0) {
        psVar4 = man_page::section::title_abi_cxx11_(this);
        poVar5 = std::operator<<((ostream *)os,(string *)psVar4);
        std::operator<<(poVar5,'\n');
      }
      psVar4 = man_page::section::content_abi_cxx11_(this);
      std::operator<<((ostream *)os,(string *)psVar4);
    }
    __gnu_cxx::
    __normal_iterator<const_clipp::man_page::section_*,_std::vector<clipp::man_page::section,_std::allocator<clipp::man_page::section>_>_>
    ::operator++(&__end2);
  }
  std::operator<<((ostream *)os,'\n');
  std::__cxx11::string::~string(local_40);
  return os;
}

Assistant:

OStream&
operator << (OStream& os, const man_page& man)
{
    bool first = true;
    const auto secSpc = doc_string(man.section_row_spacing() + 1, '\n');
    for(const auto& section : man) {
        if(!section.content().empty()) {
            if(first) first = false; else os << secSpc;
            if(!section.title().empty()) os << section.title() << '\n';
            os << section.content();
        }
    }
    os << '\n';
    return os;
}